

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

String * __thiscall
Diligent::GetLayoutElementString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,LayoutElement *Element)

{
  uint uVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  size_t sVar5;
  ostream *poVar6;
  Char *__s;
  char *pcVar7;
  uint uVar8;
  stringstream ss;
  long *local_1f8;
  uint local_1f0;
  undefined4 uStack_1ec;
  long local_1e8 [2];
  long *local_1d8;
  uint local_1d0;
  undefined4 uStack_1cc;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"HLSLSemantic: ",0xe);
  pcVar7 = *(char **)this;
  if (pcVar7 == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_1a8 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
  }
  else {
    sVar5 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", InputIndex: ",0xe);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", BufferSlot: ",0xe);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", NumComponents: ",0x11);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ValueType: ",0xd);
  __s = GetValueTypeString((VALUE_TYPE)this[0x14]);
  if (__s == (Char *)0x0) {
    std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
  }
  else {
    sVar5 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,__s,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", IsNormalized: ",0x10);
  poVar6 = std::ostream::_M_insert<bool>(SUB81(poVar6,0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", RelativeOffset: ",0x12);
  uVar1 = *(uint *)(this + 0x18);
  local_1d8 = local_1c8;
  if (uVar1 == 0xffffffff) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"auto","");
  }
  else {
    cVar4 = '\x01';
    if (9 < uVar1) {
      uVar8 = uVar1;
      cVar3 = '\x04';
      do {
        cVar4 = cVar3;
        if (uVar8 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_002fa3d6;
        }
        if (uVar8 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_002fa3d6;
        }
        if (uVar8 < 10000) goto LAB_002fa3d6;
        bVar2 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar3 = cVar4 + '\x04';
      } while (bVar2);
      cVar4 = cVar4 + '\x01';
    }
LAB_002fa3d6:
    std::__cxx11::string::_M_construct((ulong)&local_1d8,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1d8,local_1d0,uVar1);
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(char *)local_1d8,CONCAT44(uStack_1cc,local_1d0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", Stride: ",10);
  uVar1 = *(uint *)(this + 0x1c);
  if (uVar1 == 0xffffffff) {
    local_1f8 = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"auto","");
  }
  else {
    cVar4 = '\x01';
    if (9 < uVar1) {
      uVar8 = uVar1;
      cVar3 = '\x04';
      do {
        cVar4 = cVar3;
        if (uVar8 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_002fa498;
        }
        if (uVar8 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_002fa498;
        }
        if (uVar8 < 10000) goto LAB_002fa498;
        bVar2 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar3 = cVar4 + '\x04';
      } while (bVar2);
      cVar4 = cVar4 + '\x01';
    }
LAB_002fa498:
    local_1f8 = local_1e8;
    std::__cxx11::string::_M_construct((ulong)&local_1f8,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1f8,local_1f0,uVar1);
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(char *)local_1f8,CONCAT44(uStack_1ec,local_1f0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", Frequency: ",0xd);
  pcVar7 = GetInputElementFrequencyString((INPUT_ELEMENT_FREQUENCY)this[0x20]);
  sVar5 = strlen(pcVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", InstanceDataStepRate: ",0x18);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8,local_1c8[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

String GetLayoutElementString(const LayoutElement& Element)
{
    std::stringstream ss;
    ss << "HLSLSemantic: " << Element.HLSLSemantic
       << ", InputIndex: " << Element.InputIndex
       << ", BufferSlot: " << Element.BufferSlot
       << ", NumComponents: " << Element.NumComponents
       << ", ValueType: " << GetValueTypeString(Element.ValueType)
       << ", IsNormalized: " << Element.IsNormalized
       << ", RelativeOffset: " << (Element.RelativeOffset == LAYOUT_ELEMENT_AUTO_OFFSET ? "auto" : std::to_string(Element.RelativeOffset))
       << ", Stride: " << (Element.Stride == LAYOUT_ELEMENT_AUTO_STRIDE ? "auto" : std::to_string(Element.Stride))
       << ", Frequency: " << GetInputElementFrequencyString(Element.Frequency)
       << ", InstanceDataStepRate: " << Element.InstanceDataStepRate;

    return ss.str();
}